

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_parsednumber.cpp
# Opt level: O0

void __thiscall icu_63::numparse::impl::ParsedNumber::ParsedNumber(ParsedNumber *this)

{
  ParsedNumber *this_local;
  
  icu_63::number::impl::DecimalQuantity::DecimalQuantity(&this->quantity);
  UnicodeString::UnicodeString(&this->prefix);
  UnicodeString::UnicodeString(&this->suffix);
  clear(this);
  return;
}

Assistant:

ParsedNumber::ParsedNumber() {
    clear();
}